

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeGetAddress(ExpressionContext *ctx,SynGetAddress *syntax)

{
  bool bVar1;
  ExprBase *value_00;
  TypeBase *type;
  ExprBase *value;
  SynGetAddress *syntax_local;
  ExpressionContext *ctx_local;
  
  value_00 = AnalyzeExpression(ctx,syntax->value);
  bVar1 = isType<TypeError>(value_00->type);
  if (bVar1) {
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprError>(ctx);
    type = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError((ExprError *)ctx_local,&syntax->super_SynBase,type,value_00);
  }
  else {
    ctx_local = (ExpressionContext *)CreateGetAddress(ctx,&syntax->super_SynBase,value_00);
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeGetAddress(ExpressionContext &ctx, SynGetAddress *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), value);

	return CreateGetAddress(ctx, syntax, value);
}